

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O0

MPP_RET mpi_rc_pre_dec_init(MpiRc2TestCtx *ctx)

{
  MPP_RET local_3c;
  int local_38;
  MPP_RET ret;
  RK_U32 fbc_en;
  MppFrameFormat format;
  MppCtx dec_ctx;
  MppApi *dec_mpi;
  undefined4 local_18;
  RK_U32 fast_en;
  MppPollType block;
  RK_U32 need_split;
  MpiRc2TestCtx *ctx_local;
  
  fast_en = 1;
  local_18 = 0;
  dec_mpi._4_4_ = 0;
  dec_ctx = (MppCtx)0x0;
  _fbc_en = (MppCtx)0x0;
  ret = MPP_OK;
  local_38 = 0;
  _block = ctx;
  mpp_env_get_u32("fbc_dec_en",&local_38,0);
  mpp_env_get_u32("fast_en",(long)&dec_mpi + 4,0);
  if (local_38 != 0) {
    ret = ret | 0x200000;
  }
  local_3c = mpp_create(&_block->dec_ctx_pre,&_block->dec_mpi_pre);
  if (local_3c == MPP_OK) {
    dec_ctx = _block->dec_mpi_pre;
    _fbc_en = _block->dec_ctx_pre;
    local_3c = mpp_packet_init(&_block->dec_pkt_pre,_block->dec_in_buf_pre,
                               _block->dec_in_buf_pre_size);
    if (local_3c == MPP_OK) {
      local_3c = (**(code **)((long)dec_ctx + 0x70))(_fbc_en,0x310005,&fast_en);
      if (local_3c == MPP_OK) {
        local_3c = (**(code **)((long)dec_ctx + 0x70))(_fbc_en,0x310006,(long)&dec_mpi + 4);
        if (local_3c == MPP_OK) {
          local_3c = (**(code **)((long)dec_ctx + 0x70))(_fbc_en,0x200006,&local_18);
          if (local_3c == MPP_OK) {
            local_18 = 0;
            local_3c = (**(code **)((long)dec_ctx + 0x70))(_fbc_en,0x200007,&local_18);
            if (local_3c == MPP_OK) {
              local_3c = mpp_init(_fbc_en,0,_block->dec_type);
              if (local_3c == MPP_OK) {
                local_3c = (**(code **)((long)dec_ctx + 0x70))(_fbc_en,0x31000a,&ret);
                if (local_3c != MPP_OK) {
                  _mpp_log_l(2,"mpi_rc_test","dec_mpi->control failed\n",0);
                }
              }
              else {
                _mpp_log_l(2,"mpi_rc_test","mpp_init dec failed\n",0);
              }
            }
            else {
              _mpp_log_l(2,"mpi_rc_test","dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n",0);
            }
          }
          else {
            _mpp_log_l(2,"mpi_rc_test","dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n",0);
          }
        }
        else {
          _mpp_log_l(2,"mpi_rc_test","dec_mpi->control failed\n",0);
        }
      }
      else {
        _mpp_log_l(2,"mpi_rc_test","dec_mpi->control failed\n",0);
      }
    }
    else {
      _mpp_log_l(2,"mpi_rc_test","mpp_packet_init failed\n",0);
    }
  }
  else {
    _mpp_log_l(2,"mpi_rc_test","mpp_create decoder failed\n",0);
  }
  return local_3c;
}

Assistant:

static MPP_RET mpi_rc_pre_dec_init(MpiRc2TestCtx *ctx)
{
    RK_U32 need_split = 1;
    MppPollType block = MPP_POLL_NON_BLOCK;
    RK_U32 fast_en = 0;
    MppApi *dec_mpi = NULL;
    MppCtx dec_ctx = NULL;
    MppFrameFormat format = MPP_FMT_YUV420SP;
    RK_U32 fbc_en = 0;
    MPP_RET ret = MPP_OK;

    mpp_env_get_u32("fbc_dec_en", &fbc_en, 0);
    mpp_env_get_u32("fast_en", &fast_en, 0);

    if (fbc_en)
        format = format | MPP_FRAME_FBC_AFBC_V2;

    // decoder init
    ret = mpp_create(&ctx->dec_ctx_pre, &ctx->dec_mpi_pre);
    if (ret) {
        mpp_err("mpp_create decoder failed\n");
        goto MPP_TEST_OUT;
    }

    dec_mpi = ctx->dec_mpi_pre;
    dec_ctx = ctx->dec_ctx_pre;

    ret = mpp_packet_init(&ctx->dec_pkt_pre, ctx->dec_in_buf_pre, ctx->dec_in_buf_pre_size);
    if (ret) {
        mpp_err("mpp_packet_init failed\n");
        goto MPP_TEST_OUT;
    }

    ret = dec_mpi->control(dec_ctx, MPP_DEC_SET_PARSER_SPLIT_MODE, &need_split);
    if (ret) {
        mpp_err("dec_mpi->control failed\n");
        goto MPP_TEST_OUT;
    }

    ret = dec_mpi->control(dec_ctx, MPP_DEC_SET_PARSER_FAST_MODE, &fast_en);
    if (ret) {
        mpp_err("dec_mpi->control failed\n");
        goto MPP_TEST_OUT;
    }

    ret = dec_mpi->control(dec_ctx, MPP_SET_INPUT_TIMEOUT, (MppParam)&block);
    if (ret) {
        mpp_err("dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n");
        goto MPP_TEST_OUT;
    }

    block = MPP_POLL_NON_BLOCK;
    ret = dec_mpi->control(dec_ctx, MPP_SET_OUTPUT_TIMEOUT, (MppParam)&block);
    if (ret) {
        mpp_err("dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_init(dec_ctx, MPP_CTX_DEC, ctx->dec_type);
    if (ret) {
        mpp_err("mpp_init dec failed\n");
        goto MPP_TEST_OUT;
    }

    ret = dec_mpi->control(dec_ctx, MPP_DEC_SET_OUTPUT_FORMAT, &format);
    if (ret) {
        mpp_err("dec_mpi->control failed\n");
        goto MPP_TEST_OUT;
    }

MPP_TEST_OUT:
    return ret;
}